

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_color
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,
          Vec4uc *_color)

{
  short sVar1;
  Color local_c;
  
  if ((((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
       this->mesh_)->vertex_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.
      super_BaseHandle.idx_ != -1) {
    sVar1 = *(short *)((_color->super_VectorDataT<unsigned_char,_4>).values_ + 1);
    local_c.super_VectorDataT<unsigned_char,_3>.values_[2] = (uchar)((ushort)sVar1 >> 8);
    local_c.super_VectorDataT<unsigned_char,_3>.values_._0_2_ =
         sVar1 << 8 | (ushort)(_color->super_VectorDataT<unsigned_char,_4>).values_[0];
    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::set_color
              ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                *)this->mesh_,_vh,&local_c);
  }
  return;
}

Assistant:

virtual void set_color(VertexHandle _vh, const Vec4uc& _color)
  {
    if (mesh_.has_vertex_colors())
      mesh_.set_color(_vh, color_cast<Color>(_color));
  }